

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void player_outfit(player *p)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  wchar_t wVar5;
  obj_property *poVar6;
  object_kind *kind_00;
  object *obj_00;
  object *poVar7;
  int local_50;
  wchar_t eind;
  _Bool included;
  object_kind *kind;
  wchar_t num;
  obj_property *prop;
  object *known_obj;
  object *obj;
  start_item_conflict *si;
  wchar_t i;
  player *p_local;
  
  p->upkeep->total_weight = L'\0';
  p->obj_k->dd = '\x01';
  p->obj_k->ds = '\x01';
  p->obj_k->ac = 1;
  for (si._4_4_ = 1; si._4_4_ < 0x27; si._4_4_ = si._4_4_ + 1) {
    poVar6 = lookup_obj_property(3,si._4_4_);
    if (poVar6->subtype == L'\x04') {
      flag_on_dbg(p->obj_k->flags,5,si._4_4_,"p->obj_k->flags","i");
    }
    if (poVar6->subtype == L'\a') {
      flag_on_dbg(p->obj_k->flags,5,si._4_4_,"p->obj_k->flags","i");
    }
    if (poVar6->subtype == L'\b') {
      flag_on_dbg(p->obj_k->flags,5,si._4_4_,"p->obj_k->flags","i");
    }
    if (poVar6->subtype == L'\t') {
      flag_on_dbg(p->obj_k->flags,5,si._4_4_,"p->obj_k->flags","i");
    }
  }
  obj = (object *)p->class->start_items;
  do {
    if (obj == (object *)0x0) {
      if (p->au < 0) {
        p->au = 0;
      }
      wield_all(p);
      update_player_object_knowledge(p);
      return;
    }
    iVar4 = rand_range(*(int *)&obj->ego,*(int *)((long)&obj->ego + 4));
    kind._4_1_ = (uint8_t)iVar4;
    kind_00 = lookup_kind(*(wchar_t *)&obj->kind,*(wchar_t *)((long)&obj->kind + 4));
    if (kind_00 == (object_kind *)0x0) {
      __assert_fail("kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-birth.c"
                    ,0x261,"void player_outfit(struct player *)");
    }
    if (((p->opts).opt[0x27] & 1U) == 0) {
      _Var3 = tval_is_food_k(kind_00);
      if ((_Var3) || (_Var3 = tval_is_light_k(kind_00), _Var3)) {
        kind._4_1_ = '\x01';
        goto LAB_001e1f74;
      }
    }
    else {
LAB_001e1f74:
      if (obj->artifact != (artifact *)0x0) {
        bVar2 = true;
        local_50 = 0;
        while( true ) {
          bVar1 = false;
          if (*(int *)(obj->artifact->flags + (long)local_50 * 4 + -0x48) != 0) {
            bVar1 = bVar2;
          }
          if (!bVar1) break;
          if (*(int *)(obj->artifact->flags + (long)local_50 * 4 + -0x48) < 1) {
            if (((p->opts).opt[-*(int *)(obj->artifact->flags + (long)local_50 * 4 + -0x48)] & 1U)
                == 0) {
              bVar2 = false;
            }
          }
          else if (((p->opts).opt[*(int *)(obj->artifact->flags + (long)local_50 * 4 + -0x48)] & 1U)
                   != 0) {
            bVar2 = false;
          }
          local_50 = local_50 + 1;
        }
        if (!bVar2) goto LAB_001e2117;
      }
      obj_00 = object_new();
      object_prep(obj_00,kind_00,L'\0',MINIMISE);
      obj_00->number = kind._4_1_;
      obj_00->origin = '\x12';
      poVar7 = object_new();
      obj_00->known = poVar7;
      object_set_base_known(p,obj_00);
      object_flavor_aware(p,obj_00);
      obj_00->known->pval = obj_00->pval;
      obj_00->known->effect = obj_00->effect;
      obj_00->known->notice = obj_00->known->notice | 2;
      wVar5 = object_value_real(obj_00,(uint)obj_00->number);
      p->au = p->au - wVar5;
      inven_carry(p,obj_00,true,false);
      kind_00->everseen = true;
    }
LAB_001e2117:
    obj = obj->prev;
  } while( true );
}

Assistant:

static void player_outfit(struct player *p)
{
	int i;
	const struct start_item *si;
	struct object *obj, *known_obj;

	/* Currently carrying nothing */
	p->upkeep->total_weight = 0;

	/* Give the player obvious object knowledge */
	p->obj_k->dd = 1;
	p->obj_k->ds = 1;
	p->obj_k->ac = 1;
	for (i = 1; i < OF_MAX; i++) {
		struct obj_property *prop = lookup_obj_property(OBJ_PROPERTY_FLAG, i);
		if (prop->subtype == OFT_LIGHT) of_on(p->obj_k->flags, i);
		if (prop->subtype == OFT_DIG) of_on(p->obj_k->flags, i);
		if (prop->subtype == OFT_THROW) of_on(p->obj_k->flags, i);
		if (prop->subtype == OFT_CURSE_ONLY) of_on(p->obj_k->flags, i);
	}

	/* Give the player starting equipment */
	for (si = p->class->start_items; si; si = si->next) {
		int num = rand_range(si->min, si->max);
		struct object_kind *kind = lookup_kind(si->tval, si->sval);
		assert(kind);

		/* Without start_kit, only start with 1 food and 1 light */
		if (!OPT(p, birth_start_kit)) {
			if (!tval_is_food_k(kind) && !tval_is_light_k(kind))
				continue;

			num = 1;
		}

		/* Exclude if configured to do so based on birth options. */
		if (si->eopts) {
			bool included = true;
			int eind = 0;

			while (si->eopts[eind] && included) {
				if (si->eopts[eind] > 0) {
					if (p->opts.opt[si->eopts[eind]]) {
						included = false;
					}
				} else {
					if (!p->opts.opt[-si->eopts[eind]]) {
						included = false;
					}
				}
				++eind;
			}
			if (!included) continue;
		}

		/* Prepare a new item */
		obj = object_new();
		object_prep(obj, kind, 0, MINIMISE);
		obj->number = num;
		obj->origin = ORIGIN_BIRTH;

		known_obj = object_new();
		obj->known = known_obj;
		object_set_base_known(p, obj);
		object_flavor_aware(p, obj);
		obj->known->pval = obj->pval;
		obj->known->effect = obj->effect;
		obj->known->notice |= OBJ_NOTICE_ASSESSED;

		/* Deduct the cost of the item from starting cash */
		p->au -= object_value_real(obj, obj->number);

		/* Carry the item */
		inven_carry(p, obj, true, false);
		kind->everseen = true;
	}

	/* Sanity check */
	if (p->au < 0)
		p->au = 0;

	/* Now try wielding everything */
	wield_all(p);

	/* Update knowledge */
	update_player_object_knowledge(p);
}